

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O2

void __thiscall ezc3d::ParametersNS::Parameters::setMandatoryParameters(Parameters *this)

{
  bool bVar1;
  Group *pGVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  Parameter p;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  undefined8 local_d8;
  Parameter local_d0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"POINT",(allocator<char> *)&local_118);
  bVar1 = isGroup(this,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"POINT",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Group::Group((Group *)&local_d0,&local_118,&local_f8);
    group(this,(Group *)&local_d0);
    GroupNS::Group::~Group((Group *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"POINT",(allocator<char> *)&local_118);
  pGVar2 = group(this,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"USED",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"USED",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,0);
    GroupNS::Parameter::lock(&local_d0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"LABELS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"LABELS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,
                         (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0));
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"DESCRIPTIONS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DESCRIPTIONS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,
                         (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0));
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"SCALE",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"SCALE",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,-1.0);
    GroupNS::Parameter::lock(&local_d0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"UNITS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"UNITS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,
                         (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0));
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"RATE",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"RATE",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,0.0);
    GroupNS::Parameter::lock(&local_d0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"DATA_START",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DATA_START",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,0);
    GroupNS::Parameter::lock(&local_d0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"FRAMES",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"FRAMES",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,0);
    GroupNS::Parameter::lock(&local_d0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"ANALOG",(allocator<char> *)&local_118);
  bVar1 = isGroup(this,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"ANALOG",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Group::Group((Group *)&local_d0,&local_118,&local_f8);
    group(this,(Group *)&local_d0);
    GroupNS::Group::~Group((Group *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"ANALOG",(allocator<char> *)&local_118);
  pGVar2 = group(this,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"USED",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"USED",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,0);
    GroupNS::Parameter::lock(&local_d0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"LABELS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"LABELS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,
                         (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0));
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"DESCRIPTIONS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DESCRIPTIONS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,
                         (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0));
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"GEN_SCALE",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"GEN_SCALE",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,1.0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"SCALE",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"SCALE",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<double,_std::allocator<double>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"OFFSET",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"OFFSET",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<int,_std::allocator<int>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"UNITS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"UNITS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,
                         (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0));
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"RATE",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"RATE",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,0.0);
    GroupNS::Parameter::lock(&local_d0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"FORMAT",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"FORMAT",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_118,
                         (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0));
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"BITS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"BITS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<int,_std::allocator<int>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"FORCE_PLATFORM",(allocator<char> *)&local_118);
  bVar1 = isGroup(this,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"FORCE_PLATFORM",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Group::Group((Group *)&local_d0,&local_118,&local_f8);
    group(this,(Group *)&local_d0);
    GroupNS::Group::~Group((Group *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"FORCE_PLATFORM",(allocator<char> *)&local_118);
  pGVar2 = group(this,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"USED",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"USED",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GroupNS::Parameter::set(&local_d0,0);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"TYPE",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"TYPE",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<int,_std::allocator<int>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"ZERO",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"ZERO",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_d8 = 1;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_118,&local_d8);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<int,_std::allocator<int>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CORNERS",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CORNERS",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<double,_std::allocator<double>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"ORIGIN",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"ORIGIN",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<double,_std::allocator<double>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CHANNEL",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CHANNEL",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<int,_std::allocator<int>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CAL_MATRIX",(allocator<char> *)&local_118);
  bVar1 = GroupNS::Group::isParameter(pGVar2,&local_d0._name);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CAL_MATRIX",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    GroupNS::Parameter::Parameter(&local_d0,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)&local_118,0,0);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    GroupNS::Parameter::set
              (&local_d0,(vector<double,_std::allocator<double>_> *)&local_118,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_118);
    GroupNS::Group::parameter(pGVar2,&local_d0);
    GroupNS::Parameter::~Parameter(&local_d0);
  }
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::setMandatoryParameters() {
  // Mandatory groups
  {
    if (!isGroup("POINT")) {
      group(ezc3d::ParametersNS::GroupNS::Group("POINT"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("POINT"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("SCALE", "");
      p.set(-1.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("UNITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("UNITS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(0.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("DATA_START")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DATA_START", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("FRAMES")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("FRAMES", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
  }
  {
    if (!isGroup("ANALOG")) {
      group(ezc3d::ParametersNS::GroupNS::Group("ANALOG"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("ANALOG"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("GEN_SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("GEN_SCALE", "");
      p.set(1.0);
      grp.parameter(p);
    }
    if (!grp.isParameter("SCALE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("SCALE", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("OFFSET")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("OFFSET", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("UNITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("UNITS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(0.0);
      p.lock();
      grp.parameter(p);
    }
    if (!grp.isParameter("FORMAT")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("FORMAT", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("BITS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("BITS", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
  }
  {
    if (!isGroup("FORCE_PLATFORM")) {
      group(ezc3d::ParametersNS::GroupNS::Group("FORCE_PLATFORM"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("FORCE_PLATFORM"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      grp.parameter(p);
    }
    if (!grp.isParameter("TYPE")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("TYPE", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("ZERO")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("ZERO", "");
      p.set(std::vector<int>() = {1, 0});
      grp.parameter(p);
    }
    if (!grp.isParameter("CORNERS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CORNERS", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("ORIGIN")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("ORIGIN", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("CHANNEL")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CHANNEL", "");
      p.set(std::vector<int>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("CAL_MATRIX")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("CAL_MATRIX", "");
      p.set(std::vector<double>() = {});
      grp.parameter(p);
    }
  }
}